

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.h
# Opt level: O3

void __thiscall
cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(ConfidentialTxInReference *this)

{
  ~ConfidentialTxInReference(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ConfidentialTxInReference() {
    // do nothing
  }